

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::generateArguments
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,
          ExpressionList *operands,Literals *arguments)

{
  Literal *x;
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (operands->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
          usedElements;
  if (1 < uVar1) {
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::reserve
              (&(arguments->super_SmallVector<wasm::Literal,_1UL>).flexible,uVar1 - 1);
    uVar1 = (operands->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
            usedElements;
  }
  if (uVar1 != 0) {
    uVar2 = 0;
    do {
      if ((operands->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
          usedElements <= uVar2) {
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      visit(__return_storage_ptr__,this,
            (operands->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
            data[uVar2]);
      if ((__return_storage_ptr__->breakTo).super_IString.str._M_str != (char *)0x0) {
        return __return_storage_ptr__;
      }
      x = Flow::getSingleValue(__return_storage_ptr__);
      SmallVector<wasm::Literal,_1UL>::push_back
                (&arguments->super_SmallVector<wasm::Literal,_1UL>,x);
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                (&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible);
      ::wasm::Literal::~Literal
                ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                 _M_elems);
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                    _M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id =
       0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.
  i64 = 0;
  (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
  return __return_storage_ptr__;
}

Assistant:

Flow generateArguments(const ExpressionList& operands, Literals& arguments) {
    NOTE_ENTER_("generateArguments");
    arguments.reserve(operands.size());
    for (auto expression : operands) {
      Flow flow = self()->visit(expression);
      if (flow.breaking()) {
        return flow;
      }
      NOTE_EVAL1(flow.values);
      arguments.push_back(flow.getSingleValue());
    }
    return Flow();
  }